

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  pointer pcVar1;
  cmMakefile *this_00;
  _Base_ptr p_Var2;
  bool bVar3;
  cmFileSet *pcVar4;
  _Alloc_hider _Var5;
  pointer puVar6;
  mapped_type *ppcVar7;
  string *psVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  long *plVar11;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar12;
  long *plVar13;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar14;
  long lVar15;
  size_type sVar16;
  ulong uVar17;
  _Base_ptr p_Var18;
  undefined8 uVar19;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  _Base_ptr filename;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view str;
  string_view str_00;
  string_view separator;
  string prefix;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  destCge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string escapedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  string relFile;
  string dest;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  cmGeneratorExpression destGe;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  ostringstream e;
  undefined1 local_3d8 [48];
  cmFileSet *local_3a8;
  string local_3a0;
  string *local_380;
  cmGeneratorTarget *local_378;
  string *local_370;
  undefined1 local_368 [16];
  string *local_358;
  string local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_310;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  cmExportInstallFileGenerator *local_270;
  string *local_268;
  _Rb_tree_node_base *local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_258;
  undefined1 local_228 [40];
  undefined1 local_200 [32];
  long *local_1e0 [2];
  long local_1d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  char *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  pointer local_170;
  undefined8 local_168;
  char *local_160;
  ios_base local_138 [264];
  
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8 = fileSet;
  local_380 = __return_storage_ptr__;
  local_378 = gte;
  local_270 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_368 + 8),gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&local_310,fileSet);
  cmFileSet::CompileDirectoryEntries
            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              *)(local_228 + 0x10),local_3a8);
  local_288._M_ptr = (element_type *)0x0;
  local_288._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_288);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_228,(cmListFileBacktrace *)&local_288);
  if (local_288._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_refcount._M_pi);
  }
  ppcVar7 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&local_3a8);
  pcVar1 = ((*ppcVar7)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar1,
             pcVar1 + ((*ppcVar7)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_368,(string *)local_228);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  local_268 = local_358;
  if ((string *)local_368._8_8_ != local_358) {
    local_278 = &local_380->field_2;
    psVar8 = (string *)local_368._8_8_;
    do {
      local_370 = psVar8;
      cmFileSet::EvaluateDirectoryEntries
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_1d0 + 2),local_3a8,
                 (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  *)(local_228 + 0x10),local_378->LocalGenerator,psVar8,local_378,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar6 = local_310.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_258._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_258._M_impl.super__Rb_tree_header._M_header;
      local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_258._M_impl.super__Rb_tree_header._M_header._M_right =
           local_258._M_impl.super__Rb_tree_header._M_header._M_left;
      for (cge = local_310.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; cge != puVar6; cge = cge + 1) {
        cmFileSet::EvaluateFileEntry
                  (local_3a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_1d0 + 2),
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_258,cge,local_378->LocalGenerator,local_370,local_378,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      local_3a0._M_string_length = 0;
      local_3a0.field_2._M_local_buf[0] = '\0';
      uVar19 = 0;
      psVar8 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_368._0_8_,local_378->LocalGenerator
                          ,local_370,local_378,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,&local_3a0);
      str._M_str = (char *)0x1;
      str._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_2b8,(cmOutputConverter *)psVar8->_M_string_length,str,(WrapQuotes)uVar19);
      local_1a8._M_len = 0x12;
      local_1a8._M_str = "${_IMPORT_PREFIX}/";
      local_198._M_allocated_capacity = local_2b8._M_string_length;
      local_198._8_8_ = local_2b8._M_dataplus._M_p;
      local_3d8._0_8_ = (_Base_ptr)0x1;
      local_3d8._8_8_ = local_3d8 + 0x10;
      local_3d8[0x10] = 0x2f;
      local_188 = 1;
      views._M_len = 3;
      views._M_array = &local_1a8;
      local_180 = (char *)local_3d8._8_8_;
      cmCatViews_abi_cxx11_(&local_2d8,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                 local_2b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                 local_3a0.field_2._M_local_buf[0]) + 1);
      }
      pcVar4 = local_3a8;
      p_Var10 = local_258._M_impl.super__Rb_tree_header._M_header._M_left;
      if (*(bool *)(local_368._0_8_ + 0x130) == false) {
        uVar17 = local_228._24_8_ - local_228._16_8_;
        plVar11 = (long *)local_228._16_8_;
        if (0 < (long)uVar17 >> 5) {
          plVar11 = (long *)((uVar17 & 0xffffffffffffffe0) + local_228._16_8_);
          lVar15 = ((long)uVar17 >> 5) + 1;
          plVar13 = (long *)(local_228._16_8_ + 0x10);
          do {
            if (*(char *)(plVar13[-2] + 0x130) != '\0') {
              plVar13 = plVar13 + -2;
              goto LAB_004ee4a6;
            }
            if (*(char *)(plVar13[-1] + 0x130) != '\0') {
              plVar13 = plVar13 + -1;
              goto LAB_004ee4a6;
            }
            if (*(char *)(*plVar13 + 0x130) != '\0') goto LAB_004ee4a6;
            if (*(char *)(plVar13[1] + 0x130) != '\0') {
              plVar13 = plVar13 + 1;
              goto LAB_004ee4a6;
            }
            lVar15 = lVar15 + -1;
            plVar13 = plVar13 + 4;
          } while (1 < lVar15);
          uVar17 = local_228._24_8_ - (long)plVar11;
        }
        lVar15 = (long)uVar17 >> 3;
        if (lVar15 == 1) {
LAB_004ee483:
          plVar13 = plVar11;
          if (*(char *)(*plVar11 + 0x130) == '\0') {
            plVar13 = (long *)local_228._24_8_;
          }
LAB_004ee4a6:
          if (plVar13 != (long *)local_228._24_8_) goto LAB_004ee59f;
        }
        else {
          if (lVar15 == 2) {
LAB_004ee473:
            plVar13 = plVar11;
            if (*(char *)(*plVar11 + 0x130) == '\0') {
              plVar11 = plVar11 + 1;
              goto LAB_004ee483;
            }
            goto LAB_004ee4a6;
          }
          if (lVar15 == 3) {
            plVar13 = plVar11;
            if (*(char *)(*plVar11 + 0x130) == '\0') {
              plVar11 = plVar11 + 1;
              goto LAB_004ee473;
            }
            goto LAB_004ee4a6;
          }
        }
        uVar17 = (long)local_310.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_310.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        puVar12 = local_310.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)uVar17 >> 5) {
          puVar12 = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)((long)&((local_310.
                                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                               _M_head_impl + (uVar17 & 0xffffffffffffffe0));
          lVar15 = ((long)uVar17 >> 5) + 1;
          puVar14 = local_310.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if ((puVar14[-2]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar14 = puVar14 + -2;
              goto LAB_004ee596;
            }
            if ((puVar14[-1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar14 = puVar14 + -1;
              goto LAB_004ee596;
            }
            if (((puVar14->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) goto LAB_004ee596;
            if ((puVar14[1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar14 = puVar14 + 1;
              goto LAB_004ee596;
            }
            lVar15 = lVar15 + -1;
            puVar14 = puVar14 + 4;
          } while (1 < lVar15);
          uVar17 = (long)local_310.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12;
        }
        lVar15 = (long)uVar17 >> 3;
        if (lVar15 == 1) {
LAB_004ee573:
          puVar14 = puVar12;
          if (((puVar12->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar14 = local_310.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_004ee596:
          if (puVar14 !=
              local_310.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_004ee59f;
        }
        else {
          if (lVar15 == 2) {
LAB_004ee563:
            puVar14 = puVar12;
            if (((puVar12->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar12 = puVar12 + 1;
              goto LAB_004ee573;
            }
            goto LAB_004ee596;
          }
          if (lVar15 == 3) {
            puVar14 = puVar12;
            if (((puVar12->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar12 = puVar12 + 1;
              goto LAB_004ee563;
            }
            goto LAB_004ee596;
          }
        }
        bVar3 = false;
LAB_004ee765:
        while ((_Rb_tree_header *)p_Var10 != &local_258._M_impl.super__Rb_tree_header) {
          if (p_Var10[1]._M_parent == (_Base_ptr)0x0) {
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
          }
          else {
            local_3d8._8_8_ = *(undefined8 *)(p_Var10 + 1);
            local_1a8._M_len = 1;
            local_3d8._24_8_ = &local_198;
            local_198._M_local_buf[0] = 0x2f;
            local_3d8._16_8_ = 1;
            views_00._M_len = 2;
            views_00._M_array = (iterator)local_3d8;
            local_3d8._0_8_ = p_Var10[1]._M_parent;
            local_1a8._M_str = (char *)local_3d8._24_8_;
            cmCatViews_abi_cxx11_(&local_3a0,views_00);
          }
          p_Var2 = p_Var10[2]._M_parent;
          local_260 = p_Var10;
          for (filename = *(_Base_ptr *)(p_Var10 + 2); sVar16 = local_3a0._M_string_length,
              _Var5._M_p = local_3a0._M_dataplus._M_p, filename != p_Var2; filename = filename + 1)
          {
            cmsys::SystemTools::GetFilenameName((string *)local_3d8,(string *)filename);
            local_1a8._M_len = sVar16;
            local_1a8._M_str = _Var5._M_p;
            local_198._M_allocated_capacity = local_3d8._8_8_;
            local_198._8_8_ = local_3d8._0_8_;
            views_01._M_len = 2;
            views_01._M_array = &local_1a8;
            cmCatViews_abi_cxx11_(&local_2f8,views_01);
            if ((_Base_ptr)local_3d8._0_8_ != (_Base_ptr)(local_3d8 + 0x10)) {
              operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
            }
            sVar16 = local_2d8._M_string_length;
            _Var5._M_p = local_2d8._M_dataplus._M_p;
            str_00._M_str = (char *)0x1;
            str_00._M_len = (size_t)local_2f8._M_dataplus._M_p;
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      ((string *)local_3d8,(cmOutputConverter *)local_2f8._M_string_length,str_00,
                       (WrapQuotes)uVar19);
            local_1a8._M_len = sVar16;
            local_1a8._M_str = _Var5._M_p;
            local_198._M_allocated_capacity = local_3d8._8_8_;
            local_198._8_8_ = local_3d8._0_8_;
            views_02._M_len = 2;
            views_02._M_array = &local_1a8;
            cmCatViews_abi_cxx11_(&local_348,views_02);
            if ((_Base_ptr)local_3d8._0_8_ != (_Base_ptr)(local_3d8 + 0x10)) {
              operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
            }
            if ((bVar3) && ((long)local_358 - local_368._8_8_ != 0x20)) {
              local_198._8_8_ = (local_370->_M_dataplus)._M_p;
              local_198._M_allocated_capacity = local_370->_M_string_length;
              local_1a8._M_len = 0xc;
              local_1a8._M_str = "\"$<$<CONFIG:";
              local_188 = 2;
              local_180 = ">:";
              local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_348._M_string_length;
              local_170 = local_348._M_dataplus._M_p;
              local_168 = 2;
              local_160 = ">\"";
              views_04._M_len = 5;
              views_04._M_array = &local_1a8;
              cmCatViews_abi_cxx11_((string *)local_3d8,views_04);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_328,(string *)local_3d8);
              sVar16 = local_3d8._16_8_;
              p_Var18 = (_Base_ptr)local_3d8._0_8_;
              if ((_Base_ptr)local_3d8._0_8_ != (_Base_ptr)(local_3d8 + 0x10)) {
LAB_004eeaba:
                operator_delete(p_Var18,sVar16 + 1);
              }
            }
            else {
              local_2b8._M_dataplus._M_p = (pointer)0x1;
              local_2b8._M_string_length = (size_type)&local_2b8.field_2;
              local_2b8.field_2._M_local_buf[0] = '\"';
              local_1a8._M_len = 1;
              local_198._M_allocated_capacity = local_348._M_string_length;
              local_198._8_8_ = local_348._M_dataplus._M_p;
              local_3d8._0_8_ = (_Base_ptr)0x1;
              local_3d8._8_8_ = local_3d8 + 0x10;
              local_3d8[0x10] = 0x22;
              local_188 = 1;
              views_03._M_len = 3;
              views_03._M_array = &local_1a8;
              local_1a8._M_str = (char *)local_2b8._M_string_length;
              local_180 = (char *)local_3d8._8_8_;
              cmCatViews_abi_cxx11_((string *)local_200,views_03);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_328,(string *)local_200);
              sVar16 = local_200._16_8_;
              p_Var18 = (_Base_ptr)local_200._0_8_;
              if ((_Base_ptr)local_200._0_8_ != (_Base_ptr)(local_200 + 0x10)) goto LAB_004eeaba;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,
                            CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                                     local_3a0.field_2._M_local_buf[0]) + 1);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_260);
        }
        if (bVar3) {
          bVar20 = (long)local_358 - local_368._8_8_ == 0x20;
          bVar3 = !bVar20;
        }
        else {
          bVar20 = true;
          bVar3 = false;
        }
      }
      else {
LAB_004ee59f:
        plVar11 = (long *)(local_3a8->Type)._M_dataplus._M_p;
        sVar16 = (local_3a8->Type)._M_string_length;
        bVar3 = true;
        if (sVar16 == 0x17) {
          auVar21[0] = -((char)*plVar11 == 'C');
          auVar21[1] = -(*(char *)((long)plVar11 + 1) == 'X');
          auVar21[2] = -(*(char *)((long)plVar11 + 2) == 'X');
          auVar21[3] = -(*(char *)((long)plVar11 + 3) == '_');
          auVar21[4] = -(*(char *)((long)plVar11 + 4) == 'M');
          auVar21[5] = -(*(char *)((long)plVar11 + 5) == 'O');
          auVar21[6] = -(*(char *)((long)plVar11 + 6) == 'D');
          auVar21[7] = -(*(char *)((long)plVar11 + 7) == 'U');
          auVar21[8] = -((char)plVar11[1] == 'L');
          auVar21[9] = -(*(char *)((long)plVar11 + 9) == 'E');
          auVar21[10] = -(*(char *)((long)plVar11 + 10) == '_');
          auVar21[0xb] = -(*(char *)((long)plVar11 + 0xb) == 'H');
          auVar21[0xc] = -(*(char *)((long)plVar11 + 0xc) == 'E');
          auVar21[0xd] = -(*(char *)((long)plVar11 + 0xd) == 'A');
          auVar21[0xe] = -(*(char *)((long)plVar11 + 0xe) == 'D');
          auVar21[0xf] = -(*(char *)((long)plVar11 + 0xf) == 'E');
          auVar22[0] = -(*(char *)((long)plVar11 + 7) == 'U');
          auVar22[1] = -((char)plVar11[1] == 'L');
          auVar22[2] = -(*(char *)((long)plVar11 + 9) == 'E');
          auVar22[3] = -(*(char *)((long)plVar11 + 10) == '_');
          auVar22[4] = -(*(char *)((long)plVar11 + 0xb) == 'H');
          auVar22[5] = -(*(char *)((long)plVar11 + 0xc) == 'E');
          auVar22[6] = -(*(char *)((long)plVar11 + 0xd) == 'A');
          auVar22[7] = -(*(char *)((long)plVar11 + 0xe) == 'D');
          auVar22[8] = -(*(char *)((long)plVar11 + 0xf) == 'E');
          auVar22[9] = -((char)plVar11[2] == 'R');
          auVar22[10] = -(*(char *)((long)plVar11 + 0x11) == '_');
          auVar22[0xb] = -(*(char *)((long)plVar11 + 0x12) == 'U');
          auVar22[0xc] = -(*(char *)((long)plVar11 + 0x13) == 'N');
          auVar22[0xd] = -(*(char *)((long)plVar11 + 0x14) == 'I');
          auVar22[0xe] = -(*(char *)((long)plVar11 + 0x15) == 'T');
          auVar22[0xf] = -(*(char *)((long)plVar11 + 0x16) == 'S');
          auVar22 = auVar22 & auVar21;
          if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) goto LAB_004ee61a;
          goto LAB_004ee765;
        }
        if ((sVar16 != 0xb) ||
           (*(long *)((long)plVar11 + 3) != 0x53454c55444f4d5f || *plVar11 != 0x55444f4d5f585843))
        goto LAB_004ee765;
LAB_004ee61a:
        this_00 = local_270->IEGen->LocalGenerator->Makefile;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"The \"",5);
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_378);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(psVar8->_M_dataplus)._M_p,
                            psVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\" target\'s interface file set \"",0x1f);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(local_3a8->Name)._M_dataplus._M_p,
                            (local_3a8->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" of type \"",0xb);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pcVar4->Type)._M_dataplus._M_p,(pcVar4->Type)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\" contains context-sensitive base file entries which is not supported.",
                   0x46);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_3d8);
        if ((_Base_ptr)local_3d8._0_8_ != (_Base_ptr)(local_3d8 + 0x10)) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
        }
        (local_380->_M_dataplus)._M_p = (pointer)local_278;
        local_380->_M_string_length = 0;
        (local_380->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
        bVar20 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_258);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + 2));
      if (!bVar3) {
        if (!bVar20) goto LAB_004eebf7;
        break;
      }
      psVar8 = local_370 + 1;
    } while (psVar8 != local_268);
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(local_380,&local_328,separator,(string_view)ZEXT816(0));
LAB_004eebf7:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_368);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_228);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             *)(local_228 + 0x10));
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_310);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_368 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  return local_380;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  cmGeneratorExpression destGe;
  auto destCge =
    destGe.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           destCge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap),
                         '/');

    bool const contextSensitive = destCge->GetHadContextSensitiveCondition() ||
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      auto prefix = it.first.empty() ? "" : cmStrCat(it.first, '/');
      for (auto const& filename : it.second) {
        auto relFile =
          cmStrCat(prefix, cmSystemTools::GetFilenameName(filename));
        auto escapedFile =
          cmStrCat(dest,
                   cmOutputConverter::EscapeForCMake(
                     relFile, cmOutputConverter::WrapQuotes::NoWrap));
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.push_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}